

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

bool __thiscall
nlohmann::detail::
binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
::get_string<unsigned_int>
          (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *this,input_format_t format,uint len,string_t *result)

{
  byte *pbVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  
  if (len == 0) {
    bVar5 = true;
  }
  else {
    bVar5 = false;
    uVar4 = 1;
    do {
      this->chars_read = this->chars_read + 1;
      pbVar1 = (byte *)(this->ia).current;
      uVar3 = 0xffffffff;
      if (pbVar1 != (byte *)(this->ia).end) {
        uVar3 = (uint)*pbVar1;
        (this->ia).current = (char *)(pbVar1 + 1);
      }
      this->current = uVar3;
      bVar2 = unexpect_eof(this,format,"string");
      if (!bVar2) {
        return bVar5;
      }
      std::__cxx11::string::push_back((char)result);
      bVar5 = len <= uVar4;
      bVar2 = uVar4 != len;
      uVar4 = uVar4 + 1;
    } while (bVar2);
  }
  return bVar5;
}

Assistant:

bool get_string(const input_format_t format,
                    const NumberType len,
                    string_t& result)
    {
        bool success = true;
        for (NumberType i = 0; i < len; i++)
        {
            get();
            if (JSON_HEDLEY_UNLIKELY(!unexpect_eof(format, "string")))
            {
                success = false;
                break;
            }
            result.push_back(static_cast<typename string_t::value_type>(current));
        }
        return success;
    }